

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZDisassembler.c
# Opt level: O3

_Bool SystemZ_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *MI,uint16_t *size,uint64_t address,
                void *info)

{
  byte bVar1;
  cs_detail *__s;
  long lVar2;
  DecodeStatus DVar3;
  uint8_t *orig_p;
  ulong uVar4;
  uint8_t *puVar5;
  ulong uVar6;
  byte bVar7;
  uint16_t uVar8;
  uint8_t *orig_p_2;
  ulong uVar9;
  byte *pbVar10;
  uint Op;
  uint8_t *puVar11;
  ulong uVar12;
  ulong uVar13;
  uint Idx;
  uint64_t Value;
  uint64_t Value_1;
  ulong insn;
  bool bVar14;
  bool bVar15;
  DecodeStatus S;
  DecodeStatus local_44;
  byte local_3e [6];
  uint64_t local_38;
  
  bVar14 = 0xbf < *code;
  puVar11 = DecoderTable48;
  if (!bVar14) {
    puVar11 = DecoderTable32;
  }
  bVar15 = 0x3f < *code;
  uVar8 = 2;
  if (bVar15) {
    uVar8 = bVar14 + 4 + (ushort)bVar14;
  }
  uVar6 = 2;
  if (bVar15) {
    uVar6 = (ulong)((uint)bVar14 * 2) | 4;
  }
  puVar5 = DecoderTable16;
  if (bVar15) {
    puVar5 = puVar11;
  }
  *size = uVar8;
  if (code_len < uVar6) {
LAB_001bbe25:
    return false;
  }
  __s = MI->flat_insn->detail;
  local_38 = address;
  if (__s == (cs_detail *)0x0) {
    memcpy(local_3e,code,uVar6);
  }
  else {
    insn = 0;
    memset(__s,0,0x5f8);
    uVar6 = (ulong)*size;
    memcpy(local_3e,code,uVar6);
    if (uVar6 == 0) goto LAB_001bbc00;
  }
  uVar4 = 0;
  insn = 0;
  do {
    insn = insn << 8 | (ulong)local_3e[uVar4];
    uVar4 = uVar4 + 1;
  } while (uVar6 != uVar4);
LAB_001bbc00:
  uVar6 = 0;
  local_44 = MCDisassembler_Success;
LAB_001bbc1f:
  do {
LAB_001bbc22:
    puVar11 = puVar5;
    switch(*puVar11) {
    case '\x01':
      goto switchD_001bbc37_caseD_1;
    case '\x02':
      uVar4 = 0;
      uVar12 = 0;
      bVar7 = 0;
      do {
        lVar2 = uVar4 + 1;
        uVar12 = uVar12 + (long)(int)((puVar11[lVar2] & 0x7f) << (bVar7 & 0x1f));
        bVar7 = bVar7 + 7;
        uVar4 = uVar4 + 1;
      } while ((char)puVar11[lVar2] < '\0');
      puVar5 = puVar11 + (uVar4 & 0xffffffff) + 3;
      if (uVar12 != (uVar6 & 0xffffffff)) {
        puVar5 = puVar11 + (uVar4 & 0xffffffff) + 3 +
                 *(ushort *)(puVar11 + (uVar4 & 0xffffffff) + 1);
      }
      goto LAB_001bbc22;
    case '\x03':
      uVar4 = ~(-1L << (puVar11[2] & 0x3f)) << (puVar11[1] & 0x3f);
      if (puVar11[2] == 0x40) {
        uVar4 = 0xffffffffffffffff;
      }
      uVar12 = 0;
      uVar9 = 0;
      bVar7 = 0;
      do {
        bVar1 = puVar11[uVar12 + 3];
        address = (uint64_t)bVar1;
        uVar9 = uVar9 + ((bVar1 & 0x7f) << (bVar7 & 0x1f));
        bVar7 = bVar7 + 7;
        uVar12 = uVar12 + 1;
      } while ((char)bVar1 < '\0');
      puVar5 = puVar11 + (uVar12 & 0xffffffff) + 5;
      if ((uVar9 & 0xffffffff) != (uVar4 & insn) >> (puVar11[1] & 0x3f)) {
        puVar5 = puVar11 + (uVar12 & 0xffffffff) + 5 +
                 *(ushort *)(puVar11 + (uVar12 & 0xffffffff) + 3);
      }
      goto LAB_001bbc22;
    case '\x04':
      uVar4 = 0;
      do {
        lVar2 = uVar4 + 1;
        uVar4 = uVar4 + 1;
      } while ((char)puVar11[lVar2] < '\0');
      puVar5 = puVar11 + (uVar4 & 0xffffffff) + 3;
      goto LAB_001bbc22;
    case '\x05':
      uVar6 = 0;
      Op = 0;
      bVar7 = 0;
      do {
        lVar2 = uVar6 + 1;
        Op = Op + ((puVar11[lVar2] & 0x7f) << (bVar7 & 0x1f));
        bVar7 = bVar7 + 7;
        uVar6 = uVar6 + 1;
      } while ((char)puVar11[lVar2] < '\0');
      pbVar10 = puVar11 + (uVar6 & 0xffffffff) + 1;
      Idx = 0;
      bVar7 = 0;
      do {
        bVar1 = *pbVar10;
        Idx = Idx + ((bVar1 & 0x7f) << (bVar7 & 0x1f));
        bVar7 = bVar7 + 7;
        pbVar10 = pbVar10 + 1;
      } while ((char)bVar1 < '\0');
      MCInst_setOpcode(MI,Op);
      DVar3 = decodeToMCInst(local_44,Idx,insn,MI,local_38,(void *)address);
      return DVar3 != MCDisassembler_Fail;
    case '\x06':
      uVar12 = 0;
      uVar4 = 0;
      bVar7 = 0;
      do {
        lVar2 = uVar12 + 1;
        uVar4 = uVar4 + (long)(int)((puVar11[lVar2] & 0x7f) << (bVar7 & 0x1f));
        bVar7 = bVar7 + 7;
        uVar12 = uVar12 + 1;
      } while ((char)puVar11[lVar2] < '\0');
      uVar9 = 0;
      uVar13 = 0;
      bVar7 = 0;
      do {
        bVar1 = puVar11[uVar9 + (uVar12 & 0xffffffff) + 1];
        address = (uint64_t)bVar1;
        uVar13 = uVar13 + (long)(int)((bVar1 & 0x7f) << (bVar7 & 0x1f));
        bVar7 = bVar7 + 7;
        uVar9 = uVar9 + 1;
      } while ((char)bVar1 < '\0');
      puVar5 = puVar11 + (uVar9 & 0xffffffff) + (uVar12 & 0xffffffff) + 1;
      if ((uVar13 & ~insn) != 0 || (uVar4 & insn) != 0) {
        local_44 = MCDisassembler_SoftFail;
      }
      break;
    default:
      goto LAB_001bbe25;
    }
  } while( true );
switchD_001bbc37_caseD_1:
  puVar5 = puVar11 + 3;
  uVar6 = ~(-1L << (puVar11[2] & 0x3f)) << (puVar11[1] & 0x3f);
  if (puVar11[2] == 0x40) {
    uVar6 = 0xffffffffffffffff;
  }
  uVar6 = (uVar6 & insn) >> (puVar11[1] & 0x3f);
  goto LAB_001bbc1f;
}

Assistant:

bool SystemZ_getInstruction(csh ud, const uint8_t *code, size_t code_len, MCInst *MI,
		uint16_t *size, uint64_t address, void *info)
{
	uint64_t Inst;
	uint8_t Bytes[6];
	uint8_t *Table;
	uint16_t I; 

	// The top 2 bits of the first byte specify the size.
	if (*code < 0x40) {
		*size = 2;
		Table = DecoderTable16;
	} else if (*code < 0xc0) {
		*size = 4;
		Table = DecoderTable32;
	} else {
		*size = 6;
		Table = DecoderTable48;
	}

	if (code_len < *size)
		// short of input data
		return false;

	if (MI->flat_insn->detail) {
		memset(MI->flat_insn->detail, 0, sizeof(cs_detail));
	}

	memcpy(Bytes, code, *size);

	// Construct the instruction.
	Inst = 0;
	for (I = 0; I < *size; ++I)
		Inst = (Inst << 8) | Bytes[I];

	return decodeInstruction(Table, MI, Inst, address, info, 0);
}